

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.h
# Opt level: O0

void __thiscall Assimp::LWOImporter::GetS0(LWOImporter *this,string *out,uint max)

{
  size_t sVar1;
  Logger *this_00;
  ulong uVar2;
  int iVar3;
  allocator local_51;
  string local_50 [32];
  ulong local_30;
  size_t len;
  char *sz;
  uint iCursor;
  uint max_local;
  string *out_local;
  LWOImporter *this_local;
  
  sz._0_4_ = 0;
  len = (size_t)this->mFileBuffer;
  do {
    sz._4_4_ = max;
    _iCursor = out;
    out_local = (string *)this;
    if (*this->mFileBuffer == '\0') {
LAB_0066b0dc:
      sVar1 = len;
      uVar2 = (long)this->mFileBuffer - len;
      local_30 = uVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,(char *)sVar1,uVar2,&local_51);
      std::__cxx11::string::operator=((string *)_iCursor,local_50);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      iVar3 = 2;
      if ((local_30 & 1) != 0) {
        iVar3 = 1;
      }
      this->mFileBuffer = this->mFileBuffer + iVar3;
      return;
    }
    sz._0_4_ = (uint)sz + 1;
    if (max < (uint)sz) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"LWO: Invalid file, string is is too long");
      goto LAB_0066b0dc;
    }
    this->mFileBuffer = this->mFileBuffer + 1;
  } while( true );
}

Assistant:

inline void LWOImporter::GetS0(std::string& out,unsigned int max)
{
    unsigned int iCursor = 0;
    const char*sz = (const char*)mFileBuffer;
    while (*mFileBuffer)
    {
        if (++iCursor > max)
        {
            ASSIMP_LOG_WARN("LWO: Invalid file, string is is too long");
            break;
        }
        ++mFileBuffer;
    }
    size_t len = (size_t) ((const char*)mFileBuffer-sz);
    out = std::string(sz,len);
    mFileBuffer += (len&0x1 ? 1 : 2);
}